

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Subscription_deleteMembers(UA_Subscription *subscription,UA_Server *server)

{
  UA_MonitoredItem *pUVar1;
  UA_NotificationMessageEntry *pUVar2;
  UA_NotificationMessageEntry *nme_tmp;
  UA_NotificationMessageEntry *nme;
  UA_MonitoredItem *tmp_mon;
  UA_MonitoredItem *mon;
  UA_Server *server_local;
  UA_Subscription *subscription_local;
  
  Subscription_unregisterPublishJob(server,subscription);
  tmp_mon = (subscription->monitoredItems).lh_first;
  while (tmp_mon != (UA_MonitoredItem *)0x0) {
    pUVar1 = (tmp_mon->listEntry).le_next;
    if ((tmp_mon->listEntry).le_next != (UA_MonitoredItem *)0x0) {
      (((tmp_mon->listEntry).le_next)->listEntry).le_prev = (tmp_mon->listEntry).le_prev;
    }
    *(tmp_mon->listEntry).le_prev = (tmp_mon->listEntry).le_next;
    MonitoredItem_delete(server,tmp_mon);
    tmp_mon = pUVar1;
  }
  nme_tmp = (subscription->retransmissionQueue).tqh_first;
  while (nme_tmp != (UA_NotificationMessageEntry *)0x0) {
    pUVar2 = (nme_tmp->listEntry).tqe_next;
    if ((nme_tmp->listEntry).tqe_next == (UA_NotificationMessageEntry *)0x0) {
      (subscription->retransmissionQueue).tqh_last = (nme_tmp->listEntry).tqe_prev;
    }
    else {
      (((nme_tmp->listEntry).tqe_next)->listEntry).tqe_prev = (nme_tmp->listEntry).tqe_prev;
    }
    *(nme_tmp->listEntry).tqe_prev = (nme_tmp->listEntry).tqe_next;
    UA_NotificationMessage_deleteMembers(&nme_tmp->message);
    free(nme_tmp);
    nme_tmp = pUVar2;
  }
  subscription->retransmissionQueueSize = 0;
  return;
}

Assistant:

void UA_Subscription_deleteMembers(UA_Subscription *subscription, UA_Server *server) {
    Subscription_unregisterPublishJob(server, subscription);

    /* Delete monitored Items */
    UA_MonitoredItem *mon, *tmp_mon;
    LIST_FOREACH_SAFE(mon, &subscription->monitoredItems, listEntry, tmp_mon) {
        LIST_REMOVE(mon, listEntry);
        MonitoredItem_delete(server, mon);
    }

    /* Delete Retransmission Queue */
    UA_NotificationMessageEntry *nme, *nme_tmp;
    TAILQ_FOREACH_SAFE(nme, &subscription->retransmissionQueue, listEntry, nme_tmp) {
        TAILQ_REMOVE(&subscription->retransmissionQueue, nme, listEntry);
        UA_NotificationMessage_deleteMembers(&nme->message);
        UA_free(nme);
    }
    subscription->retransmissionQueueSize = 0;
}